

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testgem.cpp
# Opt level: O0

void test_font_get(void)

{
  ostream *poVar1;
  void *pvVar2;
  int local_3c;
  undefined1 local_37;
  bool local_36;
  bool local_35;
  Am_Font_Size_Flag s;
  bool is_underline;
  bool is_italic;
  bool is_bold;
  Am_Font_Family_Flag f;
  Am_String font_name;
  Am_Font local_18 [8];
  Am_Font lf;
  Am_Font defaultfont;
  
  Am_Font::Am_Font(&lf,Am_FONT_FIXED,false,false,false,Am_FONT_MEDIUM);
  Am_Font::Am_Font(local_18,Am_FONT_SERIF,true,false,true,Am_FONT_VERY_LARGE);
  Am_String::Am_String((Am_String *)&stack0xffffffffffffffd0);
  poVar1 = std::operator<<((ostream *)&std::cout,"For default font, values are: \n");
  std::ostream::operator<<(poVar1,std::flush<char,std::char_traits<char>>);
  Am_Font::Get((Am_String *)&lf,(Am_Font_Family_Flag *)&stack0xffffffffffffffd0,(bool *)&s,&local_35
               ,&local_36,(Am_Font_Size_Flag *)&local_37);
  poVar1 = std::operator<<((ostream *)&std::cout,"name ");
  poVar1 = (ostream *)operator<<(poVar1,(Am_String *)&stack0xffffffffffffffd0);
  poVar1 = std::operator<<(poVar1," family ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,s);
  poVar1 = std::operator<<(poVar1," bold ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(bool)(local_35 & 1));
  poVar1 = std::operator<<(poVar1," italic ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(bool)(local_36 & 1));
  poVar1 = std::operator<<(poVar1," underline ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(bool)(local_37 & Am_FONT_MEDIUM));
  poVar1 = std::operator<<(poVar1," size ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,local_3c);
  pvVar2 = (void *)std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar2,std::flush<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "For font serif,bold,underline,very_large, values are:\n");
  std::ostream::operator<<(poVar1,std::flush<char,std::char_traits<char>>);
  Am_Font::Get((Am_String *)local_18,(Am_Font_Family_Flag *)&stack0xffffffffffffffd0,(bool *)&s,
               &local_35,&local_36,(Am_Font_Size_Flag *)&local_37);
  poVar1 = std::operator<<((ostream *)&std::cout,"name ");
  poVar1 = (ostream *)operator<<(poVar1,(Am_String *)&stack0xffffffffffffffd0);
  poVar1 = std::operator<<(poVar1," family ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,s);
  poVar1 = std::operator<<(poVar1," bold ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(bool)(local_35 & 1));
  poVar1 = std::operator<<(poVar1," italic ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(bool)(local_36 & 1));
  poVar1 = std::operator<<(poVar1," underline ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(bool)(local_37 & Am_FONT_MEDIUM));
  poVar1 = std::operator<<(poVar1," size ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,local_3c);
  pvVar2 = (void *)std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar2,std::flush<char,std::char_traits<char>>);
  Am_String::~Am_String((Am_String *)&stack0xffffffffffffffd0);
  Am_Font::~Am_Font(local_18);
  Am_Font::~Am_Font(&lf);
  return;
}

Assistant:

void
test_font_get()
{
  Am_Font defaultfont = Am_Font();
  Am_Font lf(Am_FONT_SERIF, true, false, true, Am_FONT_VERY_LARGE);
  Am_String font_name;
  Am_Font_Family_Flag f;
  bool is_bold;
  bool is_italic;
  bool is_underline;
  Am_Font_Size_Flag s;

  std::cout << "For default font, values are: \n" << std::flush;
  defaultfont.Get(font_name, f, is_bold, is_italic, is_underline, s);
  std::cout << "name " << font_name << " family " << (int)f << " bold "
            << is_bold << " italic " << is_italic << " underline "
            << is_underline << " size " << (int)s << std::endl
            << std::flush;

  std::cout << "For font serif,bold,underline,very_large, values are:\n"
            << std::flush;
  lf.Get(font_name, f, is_bold, is_italic, is_underline, s);
  std::cout << "name " << font_name << " family " << (int)f << " bold "
            << is_bold << " italic " << is_italic << " underline "
            << is_underline << " size " << (int)s << std::endl
            << std::flush;
}